

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.cc
# Opt level: O0

MessageLite * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::AddMessage
          (RepeatedPtrFieldBase *this,MessageLite *prototype)

{
  MessageLite *pMVar1;
  MessageLite *prototype_local;
  RepeatedPtrFieldBase *this_local;
  
  pMVar1 = (MessageLite *)
           AddInternal<google::protobuf::internal::RepeatedPtrFieldBase::AddMessage(google::protobuf::MessageLite_const*)::__0>
                     (this,(anon_class_8_1_f1e7abc2)prototype);
  return pMVar1;
}

Assistant:

MessageLite* RepeatedPtrFieldBase::AddMessage(const MessageLite* prototype) {
  return static_cast<MessageLite*>(
      AddInternal([prototype](Arena* a) { return prototype->New(a); }));
}